

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrappedValue.cpp
# Opt level: O2

QString * __thiscall WrappedValue::toQString(QString *__return_storage_ptr__,WrappedValue *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  uint64_t uVar4;
  char *ch;
  bool isOk;
  QVariant val;
  bool local_91;
  anon_union_24_3_e3d07ef4_for_data local_90;
  QArrayDataPointer<char16_t> local_70;
  QVariant local_58;
  QArrayDataPointer<char16_t> local_38;
  
  if (this->m_Type == COMPLEX) {
    ch = "...";
  }
  else {
    if (this->m_Type != NONE) {
      getQVariant(&local_58,this);
      if (this->m_Type - STRING < 2) {
        QVariant::toString();
      }
      else if (this->m_Type == INT) {
        if (this->m_Size < 9) {
          local_91 = false;
          uVar4 = AbstractByteBuffer::getNumValue
                            (this->m_Owner,this->m_Offset,this->m_Size,&local_91);
          if (local_91 == false) {
            QString::QString(__return_storage_ptr__,"INVALID");
          }
          else {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            (**this->_vptr_WrappedValue)(&local_70,this);
            QString::toStdString_abi_cxx11_((string *)&local_90,(QString *)&local_70);
            QString::asprintf((char *)&local_38,local_90.shared,uVar4);
            pDVar2 = (__return_storage_ptr__->d).d;
            pcVar3 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).d = local_38.d;
            (__return_storage_ptr__->d).ptr = local_38.ptr;
            qVar1 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_38.size;
            local_38.d = pDVar2;
            local_38.ptr = pcVar3;
            local_38.size = qVar1;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
            std::__cxx11::string::~string((string *)local_90.data);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          }
        }
        else {
          QString::QString(__return_storage_ptr__,"...");
        }
      }
      else {
        getQVariant((QVariant *)&local_90,this);
        QVariant::toString();
        QVariant::~QVariant((QVariant *)&local_90);
      }
      QVariant::~QVariant(&local_58);
      return __return_storage_ptr__;
    }
    ch = "";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString WrappedValue::toQString()
{
    if (this->m_Type == NONE) return "";
    if (this->m_Type == COMPLEX) return "...";

    QVariant val = getQVariant();

    if (this->m_Type == STRING || this->m_Type == WSTRING) {
        return val.toString();
    }
    if (this->m_Type == INT) {

        bufsize_t size = this->m_Size;
        if (size > sizeof(uint64_t)) return  "...";

        bool isOk = false;
        uint64_t num = m_Owner->getNumValue(m_Offset, m_Size, &isOk);
        if (!isOk) return "INVALID";
        QString out;
#if QT_VERSION >= 0x050000
        out = QString::asprintf(getIntFormat().toStdString().c_str(), num);
#else
        out.sprintf(getIntFormat().toStdString().c_str(), num);
#endif
        return out;
    }
    return getQVariant().toString();
}